

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void copyTiled(TiledInputPart *in,TiledOutputPart *out)

{
  PixelType t;
  double dVar1;
  ulong uVar2;
  time_point end;
  time_point end_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  TileDescription *pTVar6;
  runtime_error *this;
  reference pvVar7;
  Channel *pCVar8;
  char *pcVar9;
  ostream *poVar10;
  size_t xst;
  time_point endWrite;
  int yLevel_2;
  int xLevel_2;
  int tileCount;
  time_point startWrite;
  time_point endRead;
  int yLevel_1;
  int xLevel_1;
  time_point startRead;
  int samplesize;
  ConstIterator i;
  int channelNumber;
  uint64_t offsetToOrigin;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  int yLevel;
  int xLevel;
  size_t totalPixels;
  int pixelSize;
  int levelIndex;
  vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_> frameBuffer;
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  pixelData;
  int totalLevels;
  Box2i imageDw;
  TileDescription tiling;
  int numChans;
  int in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  int in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  int in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  time_point in_stack_fffffffffffffd00;
  size_type in_stack_fffffffffffffd08;
  vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_> *in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  TileDescription *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  int local_15c;
  int local_158;
  int local_154;
  int local_140;
  int local_13c;
  Slice local_130;
  int local_f4;
  const_iterator local_f0;
  const_iterator local_e8;
  int local_dc;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  ulong local_a0;
  int local_94;
  int local_90;
  vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_> local_88;
  Slice *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  FrameBuffer *in_stack_ffffffffffffffa0;
  int iStack_20;
  
  Imf_3_3::TiledInputPart::header((TiledInputPart *)0x119044);
  channelCount((Header *)in_stack_fffffffffffffd00.__d.__r);
  Imf_3_3::TiledInputPart::header((TiledInputPart *)0x119060);
  pTVar6 = Imf_3_3::Header::tileDescription((Header *)0x119068);
  uVar2._0_4_ = pTVar6->mode;
  uVar2._4_4_ = pTVar6->roundingMode;
  Imf_3_3::TiledInputPart::header((TiledInputPart *)0x119080);
  Imf_3_3::Header::dataWindow((Header *)0x119088);
  Imath_3_1::Box<Imath_3_1::Vec2<int>_>::Box
            ((Box<Imath_3_1::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (Box<Imath_3_1::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  switch(uVar2 & 0xffffffff) {
  case 0:
  case 1:
    Imf_3_3::TiledInputPart::numLevels((TiledInputPart *)0x1190dd);
    break;
  case 2:
    Imf_3_3::TiledInputPart::numXLevels((TiledInputPart *)0x1190f6);
    Imf_3_3::TiledInputPart::numYLevels((TiledInputPart *)0x11910a);
    break;
  case 3:
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"unknown tile mode");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
               *)0x1191ad);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
            *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
           (allocator_type *)in_stack_fffffffffffffd00.__d.__r);
  std::
  allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>
                *)0x1191d9);
  std::allocator<Imf_3_3::FrameBuffer>::allocator((allocator<Imf_3_3::FrameBuffer> *)0x1191fe);
  std::vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_>::vector
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (allocator_type *)in_stack_fffffffffffffd00.__d.__r);
  std::allocator<Imf_3_3::FrameBuffer>::~allocator((allocator<Imf_3_3::FrameBuffer> *)0x11922a);
  local_90 = 0;
  local_94 = 0;
  local_a0 = 0;
  local_a4 = 0;
  while( true ) {
    iVar5 = local_a4;
    iVar4 = Imf_3_3::TiledInputPart::numXLevels((TiledInputPart *)0x119272);
    if (iVar4 <= iVar5) break;
    for (local_a8 = 0; iVar5 = local_a8,
        iVar4 = Imf_3_3::TiledInputPart::numYLevels((TiledInputPart *)0x1192b7), iVar5 < iVar4;
        local_a8 = local_a8 + 1) {
      if (((undefined4)uVar2 == 2) || (local_a4 == local_a8)) {
        in_stack_fffffffffffffce8 = local_a4;
        in_stack_fffffffffffffcf0 = local_a8;
        Imf_3_3::dataWindowForLevel
                  (in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                   (int)in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (int)in_stack_fffffffffffffd18,(int)in_stack_fffffffffffffd40,
                   (int)in_stack_fffffffffffffd48);
        local_c0 = (long)((local_b0 - local_b8) + 1);
        local_c8 = (long)((local_ac - local_b4) + 1);
        local_d0 = local_c0 * local_c8;
        local_d8 = local_c0 * local_b4 + (long)local_b8;
        local_dc = 0;
        local_94 = 0;
        std::
        vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
        ::operator[]((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                      *)&stack0xffffffffffffff98,(long)local_90);
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        Imf_3_3::TiledOutputPart::header((TiledOutputPart *)0x119404);
        Imf_3_3::Header::channels((Header *)0x11941b);
        local_e8._M_node =
             (_Base_ptr)
             Imf_3_3::ChannelList::begin
                       ((ChannelList *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8)
                       );
        while( true ) {
          Imf_3_3::TiledOutputPart::header((TiledOutputPart *)0x119459);
          Imf_3_3::Header::channels((Header *)0x119470);
          local_f0._M_node =
               (_Base_ptr)
               Imf_3_3::ChannelList::end
                         ((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          bVar3 = Imf_3_3::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
          ;
          if (!bVar3) break;
          Imf_3_3::ChannelList::ConstIterator::channel((ConstIterator *)0x1194dc);
          local_f4 = Imf_3_3::pixelTypeSize
                               ((PixelType)((ulong)in_stack_fffffffffffffd00.__d.__r >> 0x20));
          pvVar7 = std::
                   vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                 *)&stack0xffffffffffffff98,(long)local_90);
          std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::operator[](pvVar7,(long)local_dc);
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd08);
          std::vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_>::operator[]
                    (&local_88,(long)local_90);
          Imf_3_3::ChannelList::ConstIterator::name((ConstIterator *)0x119579);
          pCVar8 = Imf_3_3::ChannelList::ConstIterator::channel((ConstIterator *)0x119590);
          t = pCVar8->type;
          pvVar7 = std::
                   vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   ::operator[]((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                                 *)&stack0xffffffffffffff98,(long)local_90);
          std::
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ::operator[](pvVar7,(long)local_dc);
          pcVar9 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x1195d8);
          xst = (size_t)local_f4;
          in_stack_fffffffffffffcf8 = 0;
          in_stack_fffffffffffffcf0 = 0;
          in_stack_fffffffffffffce8 = 1;
          Imf_3_3::Slice::Slice
                    (&local_130,t,pcVar9 + -(local_d8 * xst),xst,xst * local_c0,1,1,0.0,false,false)
          ;
          Imf_3_3::FrameBuffer::insert
                    (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                     in_stack_ffffffffffffff90);
          local_dc = local_dc + 1;
          local_94 = local_f4 + local_94;
          Imf_3_3::ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0))
          ;
        }
        local_a0 = local_d0 + local_a0;
        local_90 = local_90 + 1;
      }
    }
    local_a4 = local_a4 + 1;
  }
  std::chrono::_V2::steady_clock::now();
  local_90 = 0;
  for (local_13c = 0; iVar5 = Imf_3_3::TiledInputPart::numXLevels((TiledInputPart *)0x119799),
      local_13c < iVar5; local_13c = local_13c + 1) {
    for (local_140 = 0; iVar5 = Imf_3_3::TiledInputPart::numYLevels((TiledInputPart *)0x1197de),
        local_140 < iVar5; local_140 = local_140 + 1) {
      if (((undefined4)uVar2 == 2) || (local_13c == local_140)) {
        std::vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_>::operator[]
                  (&local_88,(long)local_90);
        Imf_3_3::TiledInputPart::setFrameBuffer
                  ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (FrameBuffer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        Imf_3_3::TiledInputPart::numXTiles
                  ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
        Imf_3_3::TiledInputPart::numYTiles
                  ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
        in_stack_fffffffffffffce8 = local_140;
        Imf_3_3::TiledInputPart::readTiles
                  ((TiledInputPart *)in_stack_fffffffffffffd00.__d.__r,in_stack_fffffffffffffcfc,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0,
                   in_stack_fffffffffffffcec,(int)in_stack_fffffffffffffd10);
        local_90 = local_90 + 1;
      }
    }
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::_V2::steady_clock::now();
  local_90 = 0;
  local_154 = 0;
  for (local_158 = 0; iVar5 = Imf_3_3::TiledInputPart::numXLevels((TiledInputPart *)0x119974),
      local_158 < iVar5; local_158 = local_158 + 1) {
    for (local_15c = 0; iVar5 = Imf_3_3::TiledInputPart::numYLevels((TiledInputPart *)0x1199b9),
        local_15c < iVar5; local_15c = local_15c + 1) {
      if (((undefined4)uVar2 == 2) || (local_158 == local_15c)) {
        std::vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_>::operator[]
                  (&local_88,(long)local_90);
        Imf_3_3::TiledOutputPart::setFrameBuffer
                  ((TiledOutputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (FrameBuffer *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        Imf_3_3::TiledInputPart::numXTiles
                  ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
        Imf_3_3::TiledInputPart::numYTiles
                  ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
        in_stack_fffffffffffffce8 = local_15c;
        Imf_3_3::TiledOutputPart::writeTiles
                  ((TiledOutputPart *)in_stack_fffffffffffffd00.__d.__r,in_stack_fffffffffffffcfc,
                   in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0,
                   in_stack_fffffffffffffcec,(int)in_stack_fffffffffffffd10);
        iVar5 = Imf_3_3::TiledInputPart::numXTiles
                          ((TiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffcec);
        iVar4 = Imf_3_3::TiledInputPart::numYTiles
                          ((TiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           in_stack_fffffffffffffcec);
        local_154 = iVar5 * iVar4 + local_154;
        local_90 = local_90 + 1;
      }
    }
  }
  std::chrono::_V2::steady_clock::now();
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"read time\": ");
  end.__d.__r._4_4_ = in_stack_fffffffffffffcfc;
  end.__d.__r._0_4_ = in_stack_fffffffffffffcf8;
  dVar1 = timing(in_stack_fffffffffffffd00,end);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"write time\": ");
  end_00.__d.__r._4_4_ = in_stack_fffffffffffffcfc;
  end_00.__d.__r._0_4_ = in_stack_fffffffffffffcf8;
  dVar1 = timing(in_stack_fffffffffffffd00,end_00);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar1);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"total tiles\": ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_154);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"pixel count\": ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_a0);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"raw size\": ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_a0 * (long)local_94);
  std::operator<<(poVar10,",\n");
  std::vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_>::~vector
            ((vector<Imf_3_3::FrameBuffer,_std::allocator<Imf_3_3::FrameBuffer>_> *)poVar10);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
             *)poVar10);
  return;
}

Assistant:

void
copyTiled (TiledInputPart& in, TiledOutputPart& out)
{
    int             numChans = channelCount (in.header ());
    TileDescription tiling   = in.header ().tileDescription ();

    Box2i imageDw = in.header ().dataWindow ();
    int   totalLevels;
    switch (tiling.mode)
    {
        case ONE_LEVEL: totalLevels = 1; //break;
        case MIPMAP_LEVELS: totalLevels = in.numLevels (); break;
        case RIPMAP_LEVELS:
            totalLevels = in.numXLevels () * in.numYLevels ();
            break;
        case NUM_LEVELMODES:
        default:
            throw runtime_error ("unknown tile mode");
    }

    vector<vector<vector<char>>> pixelData (totalLevels);
    vector<FrameBuffer>          frameBuffer (totalLevels);

    int    levelIndex  = 0;
    int    pixelSize   = 0;
    size_t totalPixels = 0;

    //
    // allocate memory and initialize frameBuffer for each level
    //
    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                Box2i dw = dataWindowForLevel (
                    tiling,
                    imageDw.min.x,
                    imageDw.max.x,
                    imageDw.min.y,
                    imageDw.max.y,
                    xLevel,
                    yLevel);
                uint64_t width     = dw.max.x + 1 - dw.min.x;
                uint64_t height    = dw.max.y + 1 - dw.min.y;
                uint64_t numPixels = width * height;
                uint64_t offsetToOrigin =
                    width * static_cast<uint64_t> (dw.min.y) +
                    static_cast<uint64_t> (dw.min.x);
                int channelNumber = 0;
                pixelSize         = 0;

                pixelData[levelIndex].resize (numChans);

                for (ChannelList::ConstIterator i =
                         out.header ().channels ().begin ();
                     i != out.header ().channels ().end ();
                     ++i)
                {
                    int samplesize = pixelTypeSize (i.channel ().type);
                    pixelData[levelIndex][channelNumber].resize (
                        numPixels * samplesize);

                    frameBuffer[levelIndex].insert (
                        i.name (),
                        Slice (
                            i.channel ().type,
                            pixelData[levelIndex][channelNumber].data () -
                                offsetToOrigin * samplesize,
                            samplesize,
                            samplesize * width));
                    ++channelNumber;
                    pixelSize += samplesize;
                }
                totalPixels += numPixels;
                ++levelIndex;
            }
        }
    }

    steady_clock::time_point startRead = steady_clock::now();
    levelIndex        = 0;

    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                in.setFrameBuffer (frameBuffer[levelIndex]);
                in.readTiles (
                    0,
                    in.numXTiles (xLevel) - 1,
                    0,
                    in.numYTiles (yLevel) - 1,
                    xLevel,
                    yLevel);
                ++levelIndex;
            }
        }
    }

    steady_clock::time_point endRead = steady_clock::now();

    steady_clock::time_point startWrite = steady_clock::now();
    levelIndex         = 0;
    int tileCount      = 0;

    for (int xLevel = 0; xLevel < in.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < in.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                out.setFrameBuffer (frameBuffer[levelIndex]);
                out.writeTiles (
                    0,
                    in.numXTiles (xLevel) - 1,
                    0,
                    in.numYTiles (yLevel) - 1,
                    xLevel,
                    yLevel);
                tileCount += in.numXTiles (xLevel) * in.numYTiles (yLevel);
                ++levelIndex;
            }
        }
    }
    steady_clock::time_point endWrite = steady_clock::now();

    cout << "   \"read time\": " << timing (startRead, endRead) << ",\n";
    cout << "   \"write time\": " << timing (startWrite, endWrite) << ",\n";
    cout << "   \"total tiles\": " << tileCount << ",\n";
    cout << "   \"pixel count\": " << totalPixels << ",\n";
    cout << "   \"raw size\": " << totalPixels * pixelSize << ",\n";
}